

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.cpp
# Opt level: O1

void BadHash(void *key,int len,uint32_t seed,void *out)

{
  byte bVar1;
  byte *pbVar2;
  uint32_t h;
  uint uVar3;
  
  if (0 < len) {
    pbVar2 = (byte *)((long)len + (long)key);
    do {
      uVar3 = seed >> 3 ^ seed;
      bVar1 = *key;
      key = (void *)((long)key + 1);
      seed = uVar3 << 5 ^ uVar3 ^ (uint)bVar1;
    } while (key < pbVar2);
  }
  *(uint32_t *)out = seed;
  return;
}

Assistant:

void
BadHash(const void *key, int len, uint32_t seed, void *out)
{
  uint32_t	  h = seed;
  const uint8_t  *data = (const uint8_t *)key;
  const uint8_t *const end = &data[len];

  while (data < end) {
    h ^= h >> 3;
    h ^= h << 5;
    h ^= *data++;
  }

  *(uint32_t *) out = h;
}